

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O1

void processEvent(SWindowData *window_data,XEvent *event)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  mfb_active_func UNRECOVERED_JUMPTABLE;
  mfb_mouse_button_func UNRECOVERED_JUMPTABLE_01;
  mfb_mouse_scroll_func UNRECOVERED_JUMPTABLE_00;
  mfb_key_mod mVar4;
  mfb_mouse_button key;
  bool bVar5;
  float fVar6;
  float fVar7;
  
  iVar1 = event->type;
  switch(iVar1) {
  case 2:
  case 3:
    key = ~MOUSE_BTN_0;
    if ((ulong)(event->xkey).keycode < 0x100) {
      key = (mfb_mouse_button)g_keycodes[(event->xkey).keycode];
    }
    uVar3 = translate_mod_ex(key,(event->xcrossing).mode,(uint)(iVar1 == 2));
    window_data->mod_keys = uVar3;
    window_data->key_status[(int)key] = iVar1 == 2;
    UNRECOVERED_JUMPTABLE_01 = (mfb_mouse_button_func)window_data->keyboard_func;
    if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_button_func)0x0) {
      return;
    }
    bVar5 = iVar1 == 2;
    mVar4 = window_data->mod_keys;
    goto LAB_00104aa0;
  case 4:
  case 5:
    uVar2 = (event->xkey).state;
    key = (event->xkey).keycode;
    mVar4 = (uVar2 >> 3 & 8 | uVar2 >> 1 & 6 | uVar2 & 1) + (uVar2 & 2) * 8 + (uVar2 & 0x10) * 2;
    window_data->mod_keys = mVar4;
    switch(key) {
    case MOUSE_BTN_1:
    case MOUSE_BTN_2:
    case MOUSE_BTN_3:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_button_func)0x0) {
        return;
      }
      break;
    case MOUSE_BTN_4:
      UNRECOVERED_JUMPTABLE_00 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_00 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar7 = 1.0;
      goto LAB_00104ae0;
    case MOUSE_BTN_5:
      UNRECOVERED_JUMPTABLE_00 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_00 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar7 = -1.0;
LAB_00104ae0:
      fVar6 = 0.0;
LAB_00104ae3:
      (*UNRECOVERED_JUMPTABLE_00)((mfb_window *)window_data,mVar4,fVar6,fVar7);
      return;
    case MOUSE_BTN_6:
      UNRECOVERED_JUMPTABLE_00 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_00 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar6 = 1.0;
      goto LAB_00104aca;
    case MOUSE_BTN_7:
      UNRECOVERED_JUMPTABLE_00 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_00 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar6 = -1.0;
LAB_00104aca:
      fVar7 = 0.0;
      goto LAB_00104ae3;
    default:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_button_func)0x0) {
        return;
      }
      key = key - MOUSE_BTN_4;
    }
    bVar5 = iVar1 == 4;
LAB_00104aa0:
    (*UNRECOVERED_JUMPTABLE_01)((mfb_window *)window_data,key,mVar4,bVar5);
    return;
  case 6:
    window_data->mouse_pos_x = (event->xkey).x;
    window_data->mouse_pos_y = (event->xkey).y;
    if (window_data->mouse_move_func != (mfb_mouse_move_func)0x0) {
      (*window_data->mouse_move_func)((mfb_window *)window_data,(event->xkey).x,(event->xkey).y);
      return;
    }
    break;
  case 9:
    window_data->is_active = true;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      bVar5 = true;
LAB_00104a6f:
      (*UNRECOVERED_JUMPTABLE)((mfb_window *)window_data,bVar5);
      return;
    }
    break;
  case 10:
    window_data->is_active = false;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      bVar5 = false;
      goto LAB_00104a6f;
    }
    break;
  case 0x11:
    window_data->close = true;
    break;
  case 0x16:
    window_data->window_width = (event->xexpose).count;
    window_data->window_height = (event->xgraphicsexpose).major_code;
    resize_dst(window_data,(event->xexpose).count,(event->xgraphicsexpose).major_code);
    resize_GL(window_data);
    if (window_data->resize_func != (mfb_resize_func)0x0) {
      (*window_data->resize_func)
                ((mfb_window *)window_data,window_data->window_width,window_data->window_height);
      return;
    }
  }
  return;
}

Assistant:

static void 
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease: 
        {
            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);
            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, 1.0f);
                    break;
                case Button5:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, -1.0f);
                    break;

                case 6:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 1.0f, 0.0f);
                    break;
                case 7:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, -1.0f, 0.0f);
                    break;

                default:
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify: 
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;            
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif                
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;
    }
}